

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdManifoldMesh.cpp
# Opt level: O3

bool __thiscall HACD::TMMesh::SaveVRML2(TMMesh *this,ofstream *fout,Material *material)

{
  size_t sVar1;
  CircularListElement<HACD::TMMVertex> *pCVar2;
  char cVar3;
  ostream *poVar4;
  size_t sVar5;
  size_t sVar6;
  
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 != '\0') {
    sVar1 = (this->m_vertices).m_size;
    sVar6 = (this->m_triangles).m_size;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"#VRML V2.0 utf8",0xf);
    cVar3 = (char)fout;
    std::ios::widen((char)*(undefined8 *)(*(long *)fout + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"",0);
    std::ios::widen((char)*(undefined8 *)(*(long *)fout + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"# Vertices: ",0xc);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)fout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"# Triangles: ",0xd);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)fout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"",0);
    std::ios::widen((char)*(undefined8 *)(*(long *)fout + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"Group {",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)fout + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\tchildren [",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)fout + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t\tShape {",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)fout + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)fout,"\t\t\tappearance Appearance {",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)fout + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)fout,"\t\t\t\tmaterial Material {",0x17);
    std::ios::widen((char)*(undefined8 *)(*(long *)fout + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)fout,"\t\t\t\t\tdiffuseColor ",0x12);
    poVar4 = std::ostream::_M_insert<double>((material->m_diffuseColor).m_data[0]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    poVar4 = std::ostream::_M_insert<double>((material->m_diffuseColor).m_data[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    poVar4 = std::ostream::_M_insert<double>((material->m_diffuseColor).m_data[2]);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)fout,"\t\t\t\t\tambientIntensity ",0x16);
    poVar4 = std::ostream::_M_insert<double>(material->m_ambientIntensity);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)fout,"\t\t\t\t\tspecularColor ",0x13);
    poVar4 = std::ostream::_M_insert<double>((material->m_specularColor).m_data[0]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    poVar4 = std::ostream::_M_insert<double>((material->m_specularColor).m_data[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    poVar4 = std::ostream::_M_insert<double>((material->m_specularColor).m_data[2]);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)fout,"\t\t\t\t\temissiveColor ",0x13);
    poVar4 = std::ostream::_M_insert<double>((material->m_emissiveColor).m_data[0]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    poVar4 = std::ostream::_M_insert<double>((material->m_emissiveColor).m_data[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    poVar4 = std::ostream::_M_insert<double>((material->m_emissiveColor).m_data[2]);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t\t\t\t\tshininess ",0xf);
    poVar4 = std::ostream::_M_insert<double>(material->m_shininess);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)fout,"\t\t\t\t\ttransparency ",0x12);
    poVar4 = std::ostream::_M_insert<double>(material->m_transparency);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t\t\t\t}",5);
    std::ios::widen((char)*(undefined8 *)(*(long *)fout + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t\t\t}",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)fout + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)fout,"\t\t\tgeometry IndexedFaceSet {",0x1c);
    std::ios::widen((char)*(undefined8 *)(*(long *)fout + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t\t\t\tccw TRUE",0xc);
    std::ios::widen((char)*(undefined8 *)(*(long *)fout + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t\t\t\tsolid TRUE",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)fout + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t\t\t\tconvex TRUE",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)fout + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    if ((this->m_vertices).m_size != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)fout,"\t\t\t\tcoord DEF co Coordinate {",0x1d);
      std::ios::widen((char)*(undefined8 *)(*(long *)fout + -0x18) + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t\t\t\t\tpoint [",0xc);
      std::ios::widen((char)*(undefined8 *)(*(long *)fout + -0x18) + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
      if (sVar1 != 0) {
        sVar5 = 0;
        do {
          pCVar2 = (this->m_vertices).m_head;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t\t\t\t\t\t",6);
          poVar4 = std::ostream::_M_insert<double>((pCVar2->m_data).m_pos.m_data[0]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          poVar4 = std::ostream::_M_insert<double>((pCVar2->m_data).m_pos.m_data[1]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          poVar4 = std::ostream::_M_insert<double>((pCVar2->m_data).m_pos.m_data[2]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          (pCVar2->m_data).m_id = sVar5;
          if ((this->m_vertices).m_size != 0) {
            (this->m_vertices).m_head = ((this->m_vertices).m_head)->m_next;
          }
          sVar5 = sVar5 + 1;
        } while (sVar1 != sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t\t\t\t\t]",6);
      std::ios::widen((char)*(undefined8 *)(*(long *)fout + -0x18) + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t\t\t\t}",5);
      std::ios::widen((char)*(undefined8 *)(*(long *)fout + -0x18) + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
    }
    if ((this->m_triangles).m_size != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)fout,"\t\t\t\tcoordIndex [ ",0x11);
      std::ios::widen((char)*(undefined8 *)(*(long *)fout + -0x18) + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
      for (; sVar6 != 0; sVar6 = sVar6 - 1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t\t\t\t\t\t",6);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)fout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,", -1,",5);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        if ((this->m_triangles).m_size != 0) {
          (this->m_triangles).m_head = ((this->m_triangles).m_head)->m_next;
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t\t\t\t]",5);
      std::ios::widen((char)*(undefined8 *)(*(long *)fout + -0x18) + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t\t\t}",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)fout + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t\t}",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)fout + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t]",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)fout + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"}",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)fout + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
  }
  return true;
}

Assistant:

bool TMMesh::SaveVRML2(std::ofstream &fout, const Material & material)
    {
        if (fout.is_open()) 
        {
            size_t nV = m_vertices.GetSize();
            size_t nT = m_triangles.GetSize();            
            fout <<"#VRML V2.0 utf8" << std::endl;	    	
            fout <<"" << std::endl;
            fout <<"# Vertices: " << nV << std::endl;		
            fout <<"# Triangles: " << nT << std::endl;		
            fout <<"" << std::endl;
            fout <<"Group {" << std::endl;
            fout <<"	children [" << std::endl;
            fout <<"		Shape {" << std::endl;
            fout <<"			appearance Appearance {" << std::endl;
            fout <<"				material Material {" << std::endl;
            fout <<"					diffuseColor "      << material.m_diffuseColor.X()      << " " 
                                                            << material.m_diffuseColor.Y()      << " "
                                                            << material.m_diffuseColor.Z()      << std::endl;  
            fout <<"					ambientIntensity "  << material.m_ambientIntensity      << std::endl;
            fout <<"					specularColor "     << material.m_specularColor.X()     << " " 
                                                            << material.m_specularColor.Y()     << " "
                                                            << material.m_specularColor.Z()     << std::endl; 
            fout <<"					emissiveColor "     << material.m_emissiveColor.X()     << " " 
                                                            << material.m_emissiveColor.Y()     << " "
                                                            << material.m_emissiveColor.Z()     << std::endl; 
            fout <<"					shininess "         << material.m_shininess             << std::endl;
            fout <<"					transparency "      << material.m_transparency          << std::endl;
            fout <<"				}" << std::endl;
            fout <<"			}" << std::endl;
            fout <<"			geometry IndexedFaceSet {" << std::endl;
            fout <<"				ccw TRUE" << std::endl;
            fout <<"				solid TRUE" << std::endl;
            fout <<"				convex TRUE" << std::endl;
            if (GetNVertices() > 0) {
                fout <<"				coord DEF co Coordinate {" << std::endl;
                fout <<"					point [" << std::endl;
                for(size_t v = 0; v < nV; v++)
                {
                    TMMVertex & currentVertex = m_vertices.GetData();
                    fout <<"						" << currentVertex.m_pos.X() << " " 
                                                      << currentVertex.m_pos.Y() << " " 
                                                      << currentVertex.m_pos.Z() << "," << std::endl;
                    currentVertex.m_id = v;
                    m_vertices.Next();
                }
                fout <<"					]" << std::endl;
                fout <<"				}" << std::endl;
            }
            if (GetNTriangles() > 0) {
                fout <<"				coordIndex [ " << std::endl;
                for(size_t f = 0; f < nT; f++)
                {
                    TMMTriangle & currentTriangle = m_triangles.GetData();
                    fout <<"						" << currentTriangle.m_vertices[0]->GetData().m_id << ", " 
                                                      << currentTriangle.m_vertices[1]->GetData().m_id << ", "                                                  
                                                      << currentTriangle.m_vertices[2]->GetData().m_id << ", -1," << std::endl;
                    m_triangles.Next();
                }
                fout <<"				]" << std::endl;
            }
            fout <<"			}" << std::endl;
            fout <<"		}" << std::endl;
            fout <<"	]" << std::endl;
            fout <<"}" << std::endl;	
        }
        return true;
    }